

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled_light.cpp
# Opt level: O0

void __thiscall
randomx::CompiledLightVm<randomx::AlignedAllocator<64UL>,_true,_true>::setCache
          (CompiledLightVm<randomx::AlignedAllocator<64UL>,_true,_true> *this,randomx_cache *cache)

{
  undefined8 *in_RSI;
  long in_RDI;
  SuperscalarProgram (*in_stack_00000018) [8];
  JitCompilerX86 *in_stack_00000020;
  
  *(undefined8 **)(in_RDI + 0x9f8) = in_RSI;
  *(undefined8 *)(in_RDI + 0x9e8) = *in_RSI;
  JitCompilerX86::enableWriting((JitCompilerX86 *)0x1275ae);
  JitCompilerX86::generateSuperscalarHash<8ul>
            (in_stack_00000020,in_stack_00000018,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  JitCompilerX86::enableExecution((JitCompilerX86 *)0x1275e3);
  return;
}

Assistant:

void CompiledLightVm<Allocator, softAes, secureJit>::setCache(randomx_cache* cache) {
		cachePtr = cache;
		mem.memory = cache->memory;
		if (secureJit) {
			compiler.enableWriting();
		}
		compiler.generateSuperscalarHash(cache->programs, cache->reciprocalCache);
		if (secureJit) {
			compiler.enableExecution();
		}
	}